

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv.cc
# Opt level: O1

btree_kv_ops * btree_kv_get_kb64_vb64(btree_kv_ops *kv_ops)

{
  if (kv_ops == (btree_kv_ops *)0x0) {
    kv_ops = (btree_kv_ops *)malloc(0x78);
  }
  kv_ops->get_kv = _get_kv;
  kv_ops->set_kv = _set_kv;
  kv_ops->ins_kv = _ins_kv;
  kv_ops->copy_kv = _copy_kv;
  kv_ops->set_key = _set_key;
  kv_ops->set_value = _set_value;
  kv_ops->get_data_size = _get_data_size;
  kv_ops->get_kv_size = _get_kv_size;
  kv_ops->init_kv_var = _init_kv_var;
  kv_ops->free_kv_var = (btree_print_func *)0x0;
  kv_ops->get_nth_idx = _get_nth_idx;
  kv_ops->get_nth_splitter = _get_nth_splitter;
  kv_ops->cmp = _cmp_binary64;
  kv_ops->bid2value = _bid_to_value_64;
  kv_ops->value2bid = _value_to_bid_64;
  return kv_ops;
}

Assistant:

struct btree_kv_ops * btree_kv_get_kb64_vb64(struct btree_kv_ops *kv_ops)
{
    struct btree_kv_ops *btree_kv_ops;
    if (kv_ops) {
        btree_kv_ops = kv_ops;
    }else{
        btree_kv_ops = (struct btree_kv_ops *)malloc(sizeof(struct btree_kv_ops));
    }

    btree_kv_ops->get_kv = _get_kv;
    btree_kv_ops->set_kv = _set_kv;
    btree_kv_ops->ins_kv = _ins_kv;
    btree_kv_ops->copy_kv = _copy_kv;
    btree_kv_ops->set_key = _set_key;
    btree_kv_ops->set_value = _set_value;
    btree_kv_ops->get_data_size = _get_data_size;
    btree_kv_ops->get_kv_size = _get_kv_size;
    btree_kv_ops->init_kv_var = _init_kv_var;
    btree_kv_ops->free_kv_var = NULL;

    btree_kv_ops->get_nth_idx = _get_nth_idx;
    btree_kv_ops->get_nth_splitter = _get_nth_splitter;

    btree_kv_ops->cmp = _cmp_binary64;

    btree_kv_ops->bid2value = _bid_to_value_64;
    btree_kv_ops->value2bid = _value_to_bid_64;

    return btree_kv_ops;
}